

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void TransformDefault(uint32_t *s,uint32_t *chunk,size_t blocks)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t blocks_local;
  uint32_t *chunk_local;
  uint32_t *s_local;
  
  _b = blocks;
  blocks_local = (size_t)chunk;
  chunk_local = s;
  while (_b != 0) {
    uVar1 = *chunk_local;
    uVar2 = chunk_local[1];
    uVar3 = chunk_local[2];
    f = chunk_local[3];
    uVar4 = chunk_local[4];
    uVar5 = chunk_local[5];
    uVar6 = chunk_local[6];
    w1 = chunk_local[7];
    w0 = uVar6;
    h = uVar5;
    g = uVar4;
    e = uVar3;
    d = uVar2;
    c = uVar1;
    _b = _b - 1;
    uVar7 = be32_to_cpu(*(beint32_t *)blocks_local);
    Round(uVar1,uVar2,uVar3,&f,uVar4,uVar5,uVar6,&w1,0x428a2f98,uVar7);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar8 = be32_to_cpu(*(beint32_t *)(blocks_local + 4));
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0x71374491,uVar8);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar9 = be32_to_cpu(*(beint32_t *)(blocks_local + 8));
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0xb5c0fbcf,uVar9);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar10 = be32_to_cpu(*(beint32_t *)(blocks_local + 0xc));
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0xe9b5dba5,uVar10);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar11 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x10));
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x3956c25b,uVar11);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar12 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x14));
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0x59f111f1,uVar12);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar13 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x18));
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x923f82a4,uVar13);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar14 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x1c));
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0xab1c5ed5,uVar14);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar15 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x20));
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0xd807aa98,uVar15);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar16 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x24));
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0x12835b01,uVar16);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar17 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x28));
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0x243185be,uVar17);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar18 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x2c));
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0x550c7dc3,uVar18);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar19 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x30));
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x72be5d74,uVar19);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar20 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x34));
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0x80deb1fe,uVar20);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar21 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x38));
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x9bdc06a7,uVar21);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar22 = be32_to_cpu(*(beint32_t *)(blocks_local + 0x3c));
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0xc19bf174,uVar22);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar21);
    uVar24 = sigma0(uVar8);
    uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0xe49b69c1,uVar7);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar22);
    uVar24 = sigma0(uVar9);
    uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0xefbe4786,uVar8);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar7);
    uVar24 = sigma0(uVar10);
    uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0xfc19dc6,uVar9);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar8);
    uVar24 = sigma0(uVar11);
    uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0x240ca1cc,uVar10);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar9);
    uVar24 = sigma0(uVar12);
    uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x2de92c6f,uVar11);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar10);
    uVar24 = sigma0(uVar13);
    uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0x4a7484aa,uVar12);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar11);
    uVar24 = sigma0(uVar14);
    uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x5cb0a9dc,uVar13);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar12);
    uVar24 = sigma0(uVar15);
    uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0x76f988da,uVar14);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar13);
    uVar24 = sigma0(uVar16);
    uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0x983e5152,uVar15);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar14);
    uVar24 = sigma0(uVar17);
    uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0xa831c66d,uVar16);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar15);
    uVar24 = sigma0(uVar18);
    uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0xb00327c8,uVar17);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar16);
    uVar24 = sigma0(uVar19);
    uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0xbf597fc7,uVar18);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar17);
    uVar24 = sigma0(uVar20);
    uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0xc6e00bf3,uVar19);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar18);
    uVar24 = sigma0(uVar21);
    uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0xd5a79147,uVar20);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar19);
    uVar24 = sigma0(uVar22);
    uVar21 = uVar23 + uVar14 + uVar24 + uVar21;
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x6ca6351,uVar21);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar20);
    uVar24 = sigma0(uVar7);
    uVar22 = uVar23 + uVar15 + uVar24 + uVar22;
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0x14292967,uVar22);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar21);
    uVar24 = sigma0(uVar8);
    uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0x27b70a85,uVar7);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar22);
    uVar24 = sigma0(uVar9);
    uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0x2e1b2138,uVar8);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar7);
    uVar24 = sigma0(uVar10);
    uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0x4d2c6dfc,uVar9);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar8);
    uVar24 = sigma0(uVar11);
    uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0x53380d13,uVar10);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar9);
    uVar24 = sigma0(uVar12);
    uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x650a7354,uVar11);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar10);
    uVar24 = sigma0(uVar13);
    uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0x766a0abb,uVar12);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar11);
    uVar24 = sigma0(uVar14);
    uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x81c2c92e,uVar13);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar12);
    uVar24 = sigma0(uVar15);
    uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0x92722c85,uVar14);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar13);
    uVar24 = sigma0(uVar16);
    uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0xa2bfe8a1,uVar15);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar14);
    uVar24 = sigma0(uVar17);
    uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0xa81a664b,uVar16);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar15);
    uVar24 = sigma0(uVar18);
    uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0xc24b8b70,uVar17);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar16);
    uVar24 = sigma0(uVar19);
    uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0xc76c51a3,uVar18);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar17);
    uVar24 = sigma0(uVar20);
    uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0xd192e819,uVar19);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar18);
    uVar24 = sigma0(uVar21);
    uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0xd6990624,uVar20);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar19);
    uVar24 = sigma0(uVar22);
    uVar21 = uVar23 + uVar14 + uVar24 + uVar21;
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0xf40e3585,uVar21);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar20);
    uVar24 = sigma0(uVar7);
    uVar22 = uVar23 + uVar15 + uVar24 + uVar22;
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0x106aa070,uVar22);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar21);
    uVar24 = sigma0(uVar8);
    uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0x19a4c116,uVar7);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar22);
    uVar24 = sigma0(uVar9);
    uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0x1e376c08,uVar8);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar7);
    uVar24 = sigma0(uVar10);
    uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0x2748774c,uVar9);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar8);
    uVar24 = sigma0(uVar11);
    uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0x34b0bcb5,uVar10);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar9);
    uVar24 = sigma0(uVar12);
    uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x391c0cb3,uVar11);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar10);
    uVar24 = sigma0(uVar13);
    uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0x4ed8aa4a,uVar12);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar11);
    uVar24 = sigma0(uVar14);
    uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0x5b9cca4f,uVar13);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar12);
    uVar24 = sigma0(uVar15);
    uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0x682e6ff3,uVar14);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar13);
    uVar24 = sigma0(uVar16);
    uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
    Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&w1,0x748f82ee,uVar15);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar14);
    uVar24 = sigma0(uVar17);
    uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
    Round(uVar1,uVar6,uVar5,&e,uVar4,uVar3,uVar2,&w0,0x78a5636f,uVar16);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar15);
    uVar24 = sigma0(uVar18);
    uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
    Round(uVar2,uVar1,uVar6,&d,uVar5,uVar4,uVar3,&h,0x84c87814,uVar17);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar16);
    uVar24 = sigma0(uVar19);
    uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
    Round(uVar3,uVar2,uVar1,&c,uVar6,uVar5,uVar4,&g,0x8cc70208,uVar18);
    uVar6 = c;
    uVar5 = d;
    uVar4 = e;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w0;
    uVar23 = sigma1(uVar17);
    uVar24 = sigma0(uVar20);
    uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
    Round(uVar3,uVar2,uVar1,&w1,uVar6,uVar5,uVar4,&f,0x90befffa,uVar19);
    uVar6 = c;
    uVar5 = d;
    uVar4 = f;
    uVar3 = g;
    uVar2 = h;
    uVar1 = w1;
    uVar23 = sigma1(uVar18);
    uVar24 = sigma0(uVar21);
    uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
    Round(uVar4,uVar3,uVar2,&w0,uVar1,uVar6,uVar5,&e,0xa4506ceb,uVar20);
    uVar6 = c;
    uVar5 = e;
    uVar4 = f;
    uVar3 = g;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar19);
    uVar24 = sigma0(uVar22);
    Round(uVar5,uVar4,uVar3,&h,uVar2,uVar1,uVar6,&d,0xbef9a3f7,uVar21 + uVar23 + uVar14 + uVar24);
    uVar6 = d;
    uVar5 = e;
    uVar4 = f;
    uVar3 = h;
    uVar2 = w0;
    uVar1 = w1;
    uVar23 = sigma1(uVar20);
    uVar24 = sigma0(uVar7);
    Round(uVar6,uVar5,uVar4,&g,uVar3,uVar2,uVar1,&c,0xc67178f2,uVar22 + uVar23 + uVar15 + uVar24);
    *chunk_local = c + *chunk_local;
    chunk_local[1] = d + chunk_local[1];
    chunk_local[2] = e + chunk_local[2];
    chunk_local[3] = f + chunk_local[3];
    chunk_local[4] = g + chunk_local[4];
    chunk_local[5] = h + chunk_local[5];
    chunk_local[6] = w0 + chunk_local[6];
    chunk_local[7] = w1 + chunk_local[7];
    blocks_local = blocks_local + 0x40;
  }
  return;
}

Assistant:

static void TransformDefault(uint32_t *s, const uint32_t *chunk, size_t blocks)
{
	while (blocks--) {
		uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
		uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

		Round(a, b, c, &d, e, f, g, &h, 0x428a2f98, w0 = be32_to_cpu(chunk[0]));
		Round(h, a, b, &c, d, e, f, &g, 0x71374491, w1 = be32_to_cpu(chunk[1]));
		Round(g, h, a, &b, c, d, e, &f, 0xb5c0fbcf, w2 = be32_to_cpu(chunk[2]));
		Round(f, g, h, &a, b, c, d, &e, 0xe9b5dba5, w3 = be32_to_cpu(chunk[3]));
		Round(e, f, g, &h, a, b, c, &d, 0x3956c25b, w4 = be32_to_cpu(chunk[4]));
		Round(d, e, f, &g, h, a, b, &c, 0x59f111f1, w5 = be32_to_cpu(chunk[5]));
		Round(c, d, e, &f, g, h, a, &b, 0x923f82a4, w6 = be32_to_cpu(chunk[6]));
		Round(b, c, d, &e, f, g, h, &a, 0xab1c5ed5, w7 = be32_to_cpu(chunk[7]));
		Round(a, b, c, &d, e, f, g, &h, 0xd807aa98, w8 = be32_to_cpu(chunk[8]));
		Round(h, a, b, &c, d, e, f, &g, 0x12835b01, w9 = be32_to_cpu(chunk[9]));
		Round(g, h, a, &b, c, d, e, &f, 0x243185be, w10 = be32_to_cpu(chunk[10]));
		Round(f, g, h, &a, b, c, d, &e, 0x550c7dc3, w11 = be32_to_cpu(chunk[11]));
		Round(e, f, g, &h, a, b, c, &d, 0x72be5d74, w12 = be32_to_cpu(chunk[12]));
		Round(d, e, f, &g, h, a, b, &c, 0x80deb1fe, w13 = be32_to_cpu(chunk[13]));
		Round(c, d, e, &f, g, h, a, &b, 0x9bdc06a7, w14 = be32_to_cpu(chunk[14]));
		Round(b, c, d, &e, f, g, h, &a, 0xc19bf174, w15 = be32_to_cpu(chunk[15]));

		Round(a, b, c, &d, e, f, g, &h, 0xe49b69c1, w0 += sigma1(w14) + w9 + sigma0(w1));
		Round(h, a, b, &c, d, e, f, &g, 0xefbe4786, w1 += sigma1(w15) + w10 + sigma0(w2));
		Round(g, h, a, &b, c, d, e, &f, 0x0fc19dc6, w2 += sigma1(w0) + w11 + sigma0(w3));
		Round(f, g, h, &a, b, c, d, &e, 0x240ca1cc, w3 += sigma1(w1) + w12 + sigma0(w4));
		Round(e, f, g, &h, a, b, c, &d, 0x2de92c6f, w4 += sigma1(w2) + w13 + sigma0(w5));
		Round(d, e, f, &g, h, a, b, &c, 0x4a7484aa, w5 += sigma1(w3) + w14 + sigma0(w6));
		Round(c, d, e, &f, g, h, a, &b, 0x5cb0a9dc, w6 += sigma1(w4) + w15 + sigma0(w7));
		Round(b, c, d, &e, f, g, h, &a, 0x76f988da, w7 += sigma1(w5) + w0 + sigma0(w8));
		Round(a, b, c, &d, e, f, g, &h, 0x983e5152, w8 += sigma1(w6) + w1 + sigma0(w9));
		Round(h, a, b, &c, d, e, f, &g, 0xa831c66d, w9 += sigma1(w7) + w2 + sigma0(w10));
		Round(g, h, a, &b, c, d, e, &f, 0xb00327c8, w10 += sigma1(w8) + w3 + sigma0(w11));
		Round(f, g, h, &a, b, c, d, &e, 0xbf597fc7, w11 += sigma1(w9) + w4 + sigma0(w12));
		Round(e, f, g, &h, a, b, c, &d, 0xc6e00bf3, w12 += sigma1(w10) + w5 + sigma0(w13));
		Round(d, e, f, &g, h, a, b, &c, 0xd5a79147, w13 += sigma1(w11) + w6 + sigma0(w14));
		Round(c, d, e, &f, g, h, a, &b, 0x06ca6351, w14 += sigma1(w12) + w7 + sigma0(w15));
		Round(b, c, d, &e, f, g, h, &a, 0x14292967, w15 += sigma1(w13) + w8 + sigma0(w0));

		Round(a, b, c, &d, e, f, g, &h, 0x27b70a85, w0 += sigma1(w14) + w9 + sigma0(w1));
		Round(h, a, b, &c, d, e, f, &g, 0x2e1b2138, w1 += sigma1(w15) + w10 + sigma0(w2));
		Round(g, h, a, &b, c, d, e, &f, 0x4d2c6dfc, w2 += sigma1(w0) + w11 + sigma0(w3));
		Round(f, g, h, &a, b, c, d, &e, 0x53380d13, w3 += sigma1(w1) + w12 + sigma0(w4));
		Round(e, f, g, &h, a, b, c, &d, 0x650a7354, w4 += sigma1(w2) + w13 + sigma0(w5));
		Round(d, e, f, &g, h, a, b, &c, 0x766a0abb, w5 += sigma1(w3) + w14 + sigma0(w6));
		Round(c, d, e, &f, g, h, a, &b, 0x81c2c92e, w6 += sigma1(w4) + w15 + sigma0(w7));
		Round(b, c, d, &e, f, g, h, &a, 0x92722c85, w7 += sigma1(w5) + w0 + sigma0(w8));
		Round(a, b, c, &d, e, f, g, &h, 0xa2bfe8a1, w8 += sigma1(w6) + w1 + sigma0(w9));
		Round(h, a, b, &c, d, e, f, &g, 0xa81a664b, w9 += sigma1(w7) + w2 + sigma0(w10));
		Round(g, h, a, &b, c, d, e, &f, 0xc24b8b70, w10 += sigma1(w8) + w3 + sigma0(w11));
		Round(f, g, h, &a, b, c, d, &e, 0xc76c51a3, w11 += sigma1(w9) + w4 + sigma0(w12));
		Round(e, f, g, &h, a, b, c, &d, 0xd192e819, w12 += sigma1(w10) + w5 + sigma0(w13));
		Round(d, e, f, &g, h, a, b, &c, 0xd6990624, w13 += sigma1(w11) + w6 + sigma0(w14));
		Round(c, d, e, &f, g, h, a, &b, 0xf40e3585, w14 += sigma1(w12) + w7 + sigma0(w15));
		Round(b, c, d, &e, f, g, h, &a, 0x106aa070, w15 += sigma1(w13) + w8 + sigma0(w0));

		Round(a, b, c, &d, e, f, g, &h, 0x19a4c116, w0 += sigma1(w14) + w9 + sigma0(w1));
		Round(h, a, b, &c, d, e, f, &g, 0x1e376c08, w1 += sigma1(w15) + w10 + sigma0(w2));
		Round(g, h, a, &b, c, d, e, &f, 0x2748774c, w2 += sigma1(w0) + w11 + sigma0(w3));
		Round(f, g, h, &a, b, c, d, &e, 0x34b0bcb5, w3 += sigma1(w1) + w12 + sigma0(w4));
		Round(e, f, g, &h, a, b, c, &d, 0x391c0cb3, w4 += sigma1(w2) + w13 + sigma0(w5));
		Round(d, e, f, &g, h, a, b, &c, 0x4ed8aa4a, w5 += sigma1(w3) + w14 + sigma0(w6));
		Round(c, d, e, &f, g, h, a, &b, 0x5b9cca4f, w6 += sigma1(w4) + w15 + sigma0(w7));
		Round(b, c, d, &e, f, g, h, &a, 0x682e6ff3, w7 += sigma1(w5) + w0 + sigma0(w8));
		Round(a, b, c, &d, e, f, g, &h, 0x748f82ee, w8 += sigma1(w6) + w1 + sigma0(w9));
		Round(h, a, b, &c, d, e, f, &g, 0x78a5636f, w9 += sigma1(w7) + w2 + sigma0(w10));
		Round(g, h, a, &b, c, d, e, &f, 0x84c87814, w10 += sigma1(w8) + w3 + sigma0(w11));
		Round(f, g, h, &a, b, c, d, &e, 0x8cc70208, w11 += sigma1(w9) + w4 + sigma0(w12));
		Round(e, f, g, &h, a, b, c, &d, 0x90befffa, w12 += sigma1(w10) + w5 + sigma0(w13));
		Round(d, e, f, &g, h, a, b, &c, 0xa4506ceb, w13 += sigma1(w11) + w6 + sigma0(w14));
		Round(c, d, e, &f, g, h, a, &b, 0xbef9a3f7, w14 + sigma1(w12) + w7 + sigma0(w15));
		Round(b, c, d, &e, f, g, h, &a, 0xc67178f2, w15 + sigma1(w13) + w8 + sigma0(w0));

		s[0] += a;
		s[1] += b;
		s[2] += c;
		s[3] += d;
		s[4] += e;
		s[5] += f;
		s[6] += g;
		s[7] += h;
		chunk += 64 / sizeof(uint32_t);
	}
}